

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall wabt::interp::Thread::DoMemoryCopy(Thread *this,Instr instr,Ptr *out_trap)

{
  bool bVar1;
  Store *this_00;
  Memory *src;
  Memory *dst;
  Result RVar2;
  RunResult RVar3;
  ulong src_offset;
  ulong dst_offset;
  ulong size;
  Value VVar4;
  RefPtr<wabt::interp::Memory> local_98;
  RefPtr<wabt::interp::Memory> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  RefPtr<wabt::interp::Trap> local_48;
  
  RefPtr<wabt::interp::Memory>::RefPtr
            (&local_80,this->store_,
             (Ref)(this->inst_->memories_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32].index);
  RefPtr<wabt::interp::Memory>::RefPtr
            (&local_98,this->store_,
             (Ref)(this->inst_->memories_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32x2.snd].index);
  src = local_98.obj_;
  bVar1 = ((local_98.obj_)->type_).limits.is_64;
  VVar4 = Pop(this);
  size = (ulong)VVar4.field_0.i32_;
  if (bVar1 != false) {
    size = VVar4.field_0.i64_;
  }
  bVar1 = (src->type_).limits.is_64;
  VVar4 = Pop(this);
  dst = local_80.obj_;
  src_offset = (ulong)VVar4.field_0.i32_;
  if (bVar1 != false) {
    src_offset = VVar4.field_0.i64_;
  }
  bVar1 = ((local_80.obj_)->type_).limits.is_64;
  VVar4 = Pop(this);
  dst_offset = (ulong)VVar4.field_0.i32_;
  if (bVar1 != false) {
    dst_offset = VVar4.field_0.i64_;
  }
  RVar2 = Memory::Copy(dst,dst_offset,src,src_offset,size);
  RVar3 = Ok;
  if (RVar2.enum_ == Error) {
    this_00 = this->store_;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"out of bounds memory access: memory.copy out of bound","");
    Store::
    Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
              (&local_48,this_00,this_00,&local_68,&this->frames_);
    out_trap->obj_ = local_48.obj_;
    out_trap->store_ = local_48.store_;
    out_trap->root_index_ = local_48.root_index_;
    local_48.obj_ = (Trap *)0x0;
    local_48.store_ = (Store *)0x0;
    local_48.root_index_ = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    RVar3 = Trap;
  }
  if (local_98.obj_ != (Memory *)0x0) {
    Store::DeleteRoot(local_98.store_,local_98.root_index_);
  }
  if (local_80.obj_ != (Memory *)0x0) {
    Store::DeleteRoot(local_80.store_,local_80.root_index_);
  }
  return RVar3;
}

Assistant:

RunResult Thread::DoMemoryCopy(Instr instr, Trap::Ptr* out_trap) {
  Memory::Ptr mem_dst{store_, inst_->memories()[instr.imm_u32x2.fst]};
  Memory::Ptr mem_src{store_, inst_->memories()[instr.imm_u32x2.snd]};
  auto size = PopPtr(mem_src);
  auto src = PopPtr(mem_src);
  auto dst = PopPtr(mem_dst);
  // TODO: change to "out of bounds"
  TRAP_IF(Failed(Memory::Copy(*mem_dst, dst, *mem_src, src, size)),
          "out of bounds memory access: memory.copy out of bound");
  return RunResult::Ok;
}